

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O3

void __thiscall TidyConfigParser::parseCheckConfigs(TidyConfigParser *this)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  byte __c;
  int iVar4;
  undefined8 uVar5;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined8 extraout_RAX;
  long lVar6;
  _Alloc_hider p;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  uint uVar7;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string optionValue_1;
  string optionValue;
  string optionName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionValues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  undefined7 extraout_var;
  
  do {
    if (((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) {
      return;
    }
    while ((iVar4 = std::istream::peek(), iVar4 == 0x20 ||
           (iVar4 = std::istream::peek(), iVar4 == 9))) {
      std::istream::get();
    }
    if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) == 0) &&
       (cVar2 = std::istream::peek(), cVar2 == '\n')) {
      nextChar(this);
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    cVar2 = nextChar(this);
    uVar5 = CONCAT71(extraout_var,cVar2);
    while( true ) {
      cVar2 = (char)uVar5;
      uVar7 = (uint)uVar5;
      iVar4 = isalpha((int)cVar2);
      if (iVar4 == 0) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_b8,cVar2);
      cVar2 = nextChar(this);
      uVar5 = CONCAT71(extraout_var_00,cVar2);
    }
    if (cVar2 != ':') {
LAB_001814a5:
      local_d8._M_dataplus._M_p._0_4_ = (int)cVar2;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_d8;
      fmt_00.size_ = 0x81;
      fmt_00.data_ = (char *)0x29;
      local_d8.field_2._M_local_buf[0] = cVar2;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_f8,(v11 *)"Expected \':\' or a letter but found ({}){}",fmt_00,args_00);
      reportErrorAndExit(this,&local_f8);
LAB_001814d9:
      local_d8.field_2._M_local_buf[0] = (char)uVar7;
      local_d8._M_dataplus._M_p._0_4_ = (int)local_d8.field_2._M_local_buf[0];
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_d8;
      fmt_01.size_ = 0x81;
      fmt_01.data_ = (char *)0x32;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_f8,(v11 *)"Expected \',\' new line or a letter but found ({}){}",fmt_01,
                 args_01);
      reportErrorAndExit(this,&local_f8);
LAB_0018150d:
      local_d8._M_dataplus._M_p._0_4_ = 0x2c;
      local_d8.field_2._M_local_buf[0] = ',';
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&local_d8;
      fmt_02.size_ = 0x81;
      fmt_02.data_ = (char *)0x23;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_f8,(v11 *)"Expected new line but found: ({}){}",fmt_02,args_02);
      reportErrorAndExit(this,&local_f8);
LAB_00181542:
      local_d8._M_dataplus._M_p._0_4_ = uVar7;
      local_d8.field_2._M_local_buf[0] = (char)uVar7;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&local_d8;
      fmt_03.size_ = 0x81;
      fmt_03.data_ = (char *)0x1d;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_50,(v11 *)"Expected \'\"\' but found ({}){}",fmt_03,args_03);
      reportErrorAndExit(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while ((iVar4 = std::istream::peek(), iVar4 == 0x20 ||
           (iVar4 = std::istream::peek(), iVar4 == 9))) {
      std::istream::get();
    }
    if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) == 0) &&
       (cVar3 = std::istream::peek(), cVar3 == '[')) {
      nextChar(this);
      do {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        cVar3 = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                          (this,&local_d8);
        if (local_d8._M_string_length != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                     &local_d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                   local_d8.field_2._M_local_buf[0]) + 1);
        }
      } while (cVar3 == ',');
      if (cVar3 != ']') {
        local_d8._M_dataplus._M_p._0_4_ = (int)cVar3;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_d8;
        fmt.size_ = 0x81;
        fmt.data_ = (char *)0x1d;
        local_d8.field_2._M_local_buf[0] = cVar3;
        ::fmt::v11::vformat_abi_cxx11_(&local_f8,(v11 *)"Expected \']\' but found ({}){}",fmt,args);
        reportErrorAndExit(this,&local_f8);
        goto LAB_001814a5;
      }
      cVar2 = nextChar(this);
      uVar7 = (uint)CONCAT71(extraout_var_01,cVar2);
    }
    else {
      while ((iVar4 = std::istream::peek(), iVar4 == 0x20 ||
             (iVar4 = std::istream::peek(), iVar4 == 9))) {
        std::istream::get();
      }
      if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) == 0) &&
         (cVar2 = std::istream::peek(), cVar2 == '\"')) {
        nextChar(this);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        while( true ) {
          __c = nextChar(this);
          uVar7 = (uint)(char)__c;
          iVar4 = isalnum(uVar7);
          if ((iVar4 == 0) &&
             (((0x3b < __c - 0x24 || ((0xf800000080004f1U >> ((ulong)(__c - 0x24) & 0x3f) & 1) == 0)
               ) && (2 < __c - 0x7b)))) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_f8,__c);
        }
        if (local_f8._M_string_length != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                     &local_f8);
        }
        if (__c != 0x22) goto LAB_00181542;
        cVar2 = nextChar(this);
        uVar7 = (uint)CONCAT71(extraout_var_02,cVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          lVar6 = CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                           local_f8.field_2._M_local_buf[0]);
          p._M_p = local_f8._M_dataplus._M_p;
          goto LAB_00181344;
        }
      }
      else {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        cVar2 = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                          (this,&local_d8);
        uVar7 = (uint)CONCAT71(extraout_var_03,cVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   &local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          lVar6 = CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                           local_d8.field_2._M_local_buf[0]);
          p._M_p = local_d8._M_dataplus._M_p;
LAB_00181344:
          operator_delete(p._M_p,lVar6 + 1);
        }
      }
    }
    if ((char)uVar7 == '\0') {
LAB_00181367:
      while( true ) {
        while ((iVar4 = std::istream::peek(), iVar4 == 0x20 ||
               (iVar4 = std::istream::peek(), iVar4 == 9))) {
          std::istream::get();
        }
        if ((((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) ||
           (cVar2 = std::istream::peek(), cVar2 != '\n')) break;
        nextChar(this);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_80,&local_98);
      setCheckConfig(this,&local_b8,&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      this->parserState = Initial;
      bVar1 = false;
    }
    else {
      if ((uVar7 & 0xff) != 0x2c) {
        if ((uVar7 & 0xff) != 10) goto LAB_001814d9;
        goto LAB_00181367;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,&local_98);
      setCheckConfig(this,&local_b8,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      cVar2 = nextChar(this);
      bVar1 = true;
      if (cVar2 != '\n') goto LAB_0018150d;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void TidyConfigParser::parseCheckConfigs() {
    while (!fileStream.eof()) {
        // Parse optional newline
        if (peekChar() == '\n')
            nextChar();

        // Parse option name
        std::string optionName;
        char currentChar = readIf(optionName, isalpha);

        if (currentChar != ':') {
            reportErrorAndExit(fmt::format("Expected ':' or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse multiple option values
        std::vector<std::string> optionValues;

        auto isRegexMeta = [](char c) {
            return c == '.' || c == '^' || c == '$' || c == '*' || c == '+' || c == '?' ||
                   c == '{' || c == '}' || c == '[' || c == ']' || c == '\\' || c == '|' ||
                   c == '(' || c == ')';
        };

        auto isOptionValueChar = [](char c) { return isalnum(c) || c == '_'; };
        auto isRegexOptionValueChar = [&](char c) {
            return isalnum(c) || isRegexMeta(c) || c == '_';
        };

        if (peekChar() == '[') {
            currentChar = nextChar(); // skip '['

            do {
                std::string optionValue;
                currentChar = readIf(optionValue, isOptionValueChar);
                if (!optionValue.empty())
                    optionValues.emplace_back(optionValue);
            } while (currentChar == ',');

            if (currentChar != ']') {
                reportErrorAndExit(
                    fmt::format("Expected ']' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else if (peekChar() == '"') {
            currentChar = nextChar(); // skip '"'

            std::string optionValue;
            currentChar = readIf(optionValue, isRegexOptionValueChar);
            if (!optionValue.empty())
                optionValues.emplace_back((optionValue));

            if (currentChar != '"') {
                reportErrorAndExit(
                    fmt::format("Expected '\"' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else { // Parse single option value
            std::string optionValue;
            currentChar = readIf(optionValue, isOptionValueChar);
            optionValues.emplace_back(optionValue);
        }

        if (currentChar == ',') {
            setCheckConfig(optionName, optionValues);
            if (nextChar() != '\n') {
                reportErrorAndExit(
                    fmt::format("Expected new line but found: ({}){}", +currentChar, currentChar));
            }
        }
        else if (currentChar == '\n' || currentChar == 0) {
            while (peekChar() == '\n')
                nextChar();
            setCheckConfig(optionName, optionValues);
            parserState = ParserState::Initial;
            return;
        }
        else {
            reportErrorAndExit(fmt::format("Expected ',' new line or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }
    }
}